

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SHA256.cpp
# Opt level: O2

void __thiscall classSHA256::processChunk(classSHA256 *this)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  long lVar12;
  uint32_t _temp;
  uint32_t _temp_1;
  int iVar13;
  uint32_t uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint32_t local_54;
  
  for (lVar12 = 0; lVar12 != 0x10; lVar12 = lVar12 + 1) {
    uVar1 = (this->state).w[lVar12];
    (this->state).w[lVar12] =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  }
  uVar2 = (this->state).h[0];
  uVar3 = (this->state).h[1];
  uVar4 = (this->state).h[2];
  uVar5 = (this->state).h[3];
  uVar6 = (this->state).h[4];
  uVar1 = (this->state).h[5];
  uVar7 = (this->state).h[6];
  uVar8 = (this->state).h[7];
  uVar14 = uVar2;
  uVar22 = uVar3;
  uVar23 = uVar4;
  uVar10 = uVar6;
  uVar19 = uVar1;
  uVar20 = uVar7;
  uVar11 = uVar5;
  local_54 = uVar8;
  for (lVar12 = 0; uVar15 = uVar20, uVar20 = uVar19, uVar19 = uVar10, uVar16 = uVar23,
      uVar23 = uVar22, uVar22 = uVar14, lVar12 != 0x40; lVar12 = lVar12 + 4) {
    iVar13 = ((uVar20 ^ uVar15) & uVar19 ^ uVar15) + local_54 +
             ((uVar19 << 7 | uVar19 >> 0x19) ^
             (uVar19 << 0x15 | uVar19 >> 0xb) ^ (uVar19 << 0x1a | uVar19 >> 6)) +
             *(int *)((long)processChunk::k + lVar12) + *(int *)((long)(this->state).w + lVar12);
    uVar14 = (uVar23 & uVar16 ^ (uVar23 ^ uVar16) & uVar22) +
             ((uVar22 << 10 | uVar22 >> 0x16) ^
             (uVar22 << 0x13 | uVar22 >> 0xd) ^ (uVar22 << 0x1e | uVar22 >> 2)) + iVar13;
    uVar10 = uVar11 + iVar13;
    uVar11 = uVar16;
    local_54 = uVar15;
  }
  for (lVar12 = 0x1e; uVar18 = uVar15, uVar15 = uVar20, uVar20 = uVar19, uVar21 = uVar16,
      uVar16 = uVar23, uVar23 = uVar22, lVar12 != 0x4e; lVar12 = lVar12 + 1) {
    uVar9 = (uint)lVar12;
    uVar22 = (this->state).w[uVar9 - 0xd & 0xf];
    uVar19 = (this->state).w[uVar9 & 0xf];
    uVar17 = uVar9 - 0xe & 0xf;
    uVar14 = (uVar19 >> 10 ^ (uVar19 << 0xd | uVar19 >> 0x13) ^ (uVar19 << 0xf | uVar19 >> 0x11)) +
             (this->state).w[uVar9 - 5 & 0xf] + (this->state).w[uVar17] +
             (uVar22 >> 3 ^ (uVar22 << 0xe | uVar22 >> 0x12) ^ (uVar22 << 0x19 | uVar22 >> 7));
    (this->state).w[uVar17] = uVar14;
    iVar13 = ((uVar15 ^ uVar18) & uVar20 ^ uVar18) + local_54 +
             ((uVar20 << 7 | uVar20 >> 0x19) ^
             (uVar20 << 0x15 | uVar20 >> 0xb) ^ (uVar20 << 0x1a | uVar20 >> 6)) +
             *(int *)(&UNK_001c4368 + lVar12 * 4) + uVar14;
    uVar22 = (uVar16 & uVar21 ^ (uVar16 ^ uVar21) & uVar23) +
             ((uVar23 << 10 | uVar23 >> 0x16) ^
             (uVar23 << 0x13 | uVar23 >> 0xd) ^ (uVar23 << 0x1e | uVar23 >> 2)) + iVar13;
    uVar19 = uVar11 + iVar13;
    uVar11 = uVar21;
    local_54 = uVar18;
  }
  (this->state).h[0] = uVar23 + uVar2;
  (this->state).h[1] = uVar16 + uVar3;
  (this->state).h[2] = uVar21 + uVar4;
  (this->state).h[3] = uVar11 + uVar5;
  (this->state).h[4] = uVar20 + uVar6;
  (this->state).h[5] = uVar15 + uVar1;
  (this->state).h[6] = uVar18 + uVar7;
  (this->state).h[7] = local_54 + uVar8;
  return;
}

Assistant:

void classSHA256::processChunk()
{
    // Round constants for SHA-256.
    static uint32_t const k[64] PROGMEM = {
        0x428a2f98, 0x71374491, 0xb5c0fbcf, 0xe9b5dba5,
        0x3956c25b, 0x59f111f1, 0x923f82a4, 0xab1c5ed5,
        0xd807aa98, 0x12835b01, 0x243185be, 0x550c7dc3,
        0x72be5d74, 0x80deb1fe, 0x9bdc06a7, 0xc19bf174,
        0xe49b69c1, 0xefbe4786, 0x0fc19dc6, 0x240ca1cc,
        0x2de92c6f, 0x4a7484aa, 0x5cb0a9dc, 0x76f988da,
        0x983e5152, 0xa831c66d, 0xb00327c8, 0xbf597fc7,
        0xc6e00bf3, 0xd5a79147, 0x06ca6351, 0x14292967,
        0x27b70a85, 0x2e1b2138, 0x4d2c6dfc, 0x53380d13,
        0x650a7354, 0x766a0abb, 0x81c2c92e, 0x92722c85,
        0xa2bfe8a1, 0xa81a664b, 0xc24b8b70, 0xc76c51a3,
        0xd192e819, 0xd6990624, 0xf40e3585, 0x106aa070,
        0x19a4c116, 0x1e376c08, 0x2748774c, 0x34b0bcb5,
        0x391c0cb3, 0x4ed8aa4a, 0x5b9cca4f, 0x682e6ff3,
        0x748f82ee, 0x78a5636f, 0x84c87814, 0x8cc70208,
        0x90befffa, 0xa4506ceb, 0xbef9a3f7, 0xc67178f2
    };

    // Convert the first 16 words from big endian to host byte order.
    uint8_t index;
    for (index = 0; index < 16; ++index)
        state.w[index] = be32toh(state.w[index]);

    // Initialise working variables to the current hash value.
    uint32_t a = state.h[0];
    uint32_t b = state.h[1];
    uint32_t c = state.h[2];
    uint32_t d = state.h[3];
    uint32_t e = state.h[4];
    uint32_t f = state.h[5];
    uint32_t g = state.h[6];
    uint32_t h = state.h[7];

    // Perform the first 16 rounds of the compression function main loop.
    uint32_t temp1, temp2;
    for (index = 0; index < 16; ++index) {
        temp1 = h + pgm_read_dword(k + index) + state.w[index] +
                (rightRotate6(e) ^ rightRotate11(e) ^ rightRotate25(e)) +
                ((e & f) ^ ((~e) & g));
        temp2 = (rightRotate2(a) ^ rightRotate13(a) ^ rightRotate22(a)) +
                ((a & b) ^ (a & c) ^ (b & c));
        h = g;
        g = f;
        f = e;
        e = d + temp1;
        d = c;
        c = b;
        b = a;
        a = temp1 + temp2;
    }

    // Perform the 48 remaining rounds.  We expand the first 16 words to
    // 64 in-place in the "w" array.  This saves 192 bytes of memory
    // that would have otherwise need to be allocated to the "w" array.
    for (; index < 64; ++index) {
        // Expand the next word.
        temp1 = state.w[(index - 15) & 0x0F];
        temp2 = state.w[(index - 2) & 0x0F];
        temp1 = state.w[index & 0x0F] =
            state.w[(index - 16) & 0x0F] + state.w[(index - 7) & 0x0F] +
                (rightRotate7(temp1) ^ rightRotate18(temp1) ^ (temp1 >> 3)) +
                (rightRotate17(temp2) ^ rightRotate19(temp2) ^ (temp2 >> 10));

        // Perform the round.
        temp1 = h + pgm_read_dword(k + index) + temp1 +
                (rightRotate6(e) ^ rightRotate11(e) ^ rightRotate25(e)) +
                ((e & f) ^ ((~e) & g));
        temp2 = (rightRotate2(a) ^ rightRotate13(a) ^ rightRotate22(a)) +
                ((a & b) ^ (a & c) ^ (b & c));
        h = g;
        g = f;
        f = e;
        e = d + temp1;
        d = c;
        c = b;
        b = a;
        a = temp1 + temp2;
    }

    // Add the compressed chunk to the current hash value.
    state.h[0] += a;
    state.h[1] += b;
    state.h[2] += c;
    state.h[3] += d;
    state.h[4] += e;
    state.h[5] += f;
    state.h[6] += g;
    state.h[7] += h;

    // Attempt to clean up the stack.
    a = b = c = d = e = f = g = h = temp1 = temp2 = 0;
}